

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O1

void __thiscall
duckdb::SerializationException::
SerializationException<std::__cxx11::string,std::__cxx11::string,duckdb::LogicalType,duckdb::LogicalType>
          (SerializationException *this,string *msg,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params_1,
          LogicalType *params_2,LogicalType *params_3)

{
  pointer pcVar1;
  LogicalType *in_stack_ffffffffffffff38;
  string local_c0;
  LogicalType local_a0;
  undefined1 local_88 [24];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
  pcVar1 = (params->_M_dataplus)._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_c0,pcVar1,pcVar1 + params->_M_string_length);
  pcVar1 = (params_1->_M_dataplus)._M_p;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)(local_88 + 0x18),pcVar1,pcVar1 + params_1->_M_string_length);
  LogicalType::LogicalType((LogicalType *)local_88,params_2);
  LogicalType::LogicalType(&local_a0,params_3);
  Exception::
  ConstructMessage<std::__cxx11::string,std::__cxx11::string,duckdb::LogicalType,duckdb::LogicalType>
            (&local_50,(Exception *)msg,&local_c0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_88 + 0x18),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88,&local_a0
             ,in_stack_ffffffffffffff38);
  SerializationException(this,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  LogicalType::~LogicalType(&local_a0);
  LogicalType::~LogicalType((LogicalType *)local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p);
  }
  return;
}

Assistant:

explicit SerializationException(const string &msg, ARGS... params)
	    : SerializationException(ConstructMessage(msg, params...)) {
	}